

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_context::cancel_tasks
          (server_context *this,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *id_tasks)

{
  common_log *log;
  __node_base *p_Var1;
  vector<server_task,_std::allocator<server_task>_> cancel_tasks;
  server_task task;
  
  cancel_tasks.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cancel_tasks.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cancel_tasks.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::reserve
            (&cancel_tasks,(id_tasks->_M_h)._M_element_count);
  p_Var1 = &(id_tasks->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_WARN,"srv  %12.*s: cancel task, id_task = %d\n",0xc,
                     "cancel_tasks",(ulong)(uint)*(size_type *)(p_Var1 + 1));
    }
    server_task::server_task(&task,SERVER_TASK_TYPE_CANCEL);
    task.id_target = (int)*(size_type *)(p_Var1 + 1);
    server_response::remove_waiting_task_id(&this->queue_results,task.id_target);
    httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::
    emplace_back<server_task>(&cancel_tasks,&task);
    server_task::~server_task(&task);
  }
  server_queue::post(&this->queue_tasks,&cancel_tasks,true);
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::~vector(&cancel_tasks);
  return;
}

Assistant:

void cancel_tasks(const std::unordered_set<int> & id_tasks) {
        std::vector<server_task> cancel_tasks;
        cancel_tasks.reserve(id_tasks.size());
        for (const auto & id_task : id_tasks) {
            SRV_WRN("cancel task, id_task = %d\n", id_task);

            server_task task(SERVER_TASK_TYPE_CANCEL);
            task.id_target = id_task;
            queue_results.remove_waiting_task_id(id_task);
            cancel_tasks.push_back(std::move(task));
        }
        // push to beginning of the queue, so it has highest priority
        queue_tasks.post(std::move(cancel_tasks), true);
    }